

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,Select *pSelect)

{
  undefined8 *puVar1;
  short sVar2;
  sqlite3 *db;
  Table *data;
  ExprList *pEVar3;
  Schema *pSVar4;
  _func_void_ptr_sqlite3_ptr__func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64_ptr_void_ptr *z;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  Vdbe *p;
  Table *pTable;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  Column *pCVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  char *zBuf;
  char *zFormat;
  char *pcVar19;
  SrcList sSrc;
  NameContext local_68;
  
  if (((pEnd != (Token *)0x0 || pSelect != (Select *)0x0) &&
      (db = pParse->db, db->mallocFailed == '\0')) &&
     (data = pParse->pNewTable, data != (Table *)0x0)) {
    iVar6 = sqlite3SchemaToIndex(db,data->pSchema);
    if (data->pCheck == (ExprList *)0x0) {
LAB_00160f03:
      if ((db->init).busy == '\0') {
        p = sqlite3GetVdbe(pParse);
        if (p == (Vdbe *)0x0) {
          return;
        }
        sqlite3VdbeAddOp1(p,0x2d,0);
        pcVar14 = "view";
        if (data->pSelect == (Select *)0x0) {
          pcVar14 = "table";
        }
        if (pSelect == (Select *)0x0) {
          pcVar12 = "VIEW";
          if (data->pSelect == (Select *)0x0) {
            pcVar12 = "TABLE";
          }
          pcVar12 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar12,
                                   (ulong)((*(int *)&pEnd->z - (int)(pParse->sNameToken).z) + 1));
        }
        else {
          sqlite3VdbeAddOp3(p,0x28,1,pParse->regRoot,iVar6);
          if (p->aOp != (Op *)0x0) {
            p->aOp[(long)p->nOp + -1].p5 = '\x02';
          }
          pParse->nTab = 2;
          sSrc.nSrc = 8;
          sSrc._4_4_ = 1;
          sSrc.a[0].pSchema = (Schema *)0x0;
          sqlite3Select(pParse,pSelect,(SelectDest *)&sSrc);
          sqlite3VdbeAddOp1(p,0x2d,1);
          if (pParse->nErr == 0) {
            pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
            if (pTable == (Table *)0x0) {
              return;
            }
            data->nCol = pTable->nCol;
            data->aCol = pTable->aCol;
            pTable->nCol = 0;
            pTable->aCol = (Column *)0x0;
            sqlite3DeleteTable(db,pTable);
          }
          pCVar15 = data->aCol;
          sVar2 = data->nCol;
          lVar17 = 0;
          iVar7 = 0;
          if (0 < sVar2) {
            iVar7 = (int)sVar2;
          }
          iVar16 = 0;
          for (; iVar7 * 0x30 - (int)lVar17 != 0; lVar17 = lVar17 + 0x30) {
            iVar8 = identLength(*(char **)((long)&pCVar15->zName + lVar17));
            iVar16 = iVar16 + iVar8 + 5;
          }
          iVar7 = identLength(data->zName);
          iVar7 = iVar7 + iVar16;
          pcVar13 = ",\n  ";
          if (iVar7 < 0x32) {
            pcVar13 = ",";
          }
          pcVar19 = "\n)";
          if (iVar7 < 0x32) {
            pcVar19 = ")";
          }
          iVar16 = sVar2 * 6 + iVar7 + 0x23;
          pcVar12 = (char *)sqlite3Malloc(iVar16);
          if (pcVar12 == (char *)0x0) {
            db->mallocFailed = '\x01';
          }
          else {
            zFormat = "\n  ";
            if (iVar7 < 0x32) {
              zFormat = "";
            }
            sqlite3_snprintf(iVar16,pcVar12,"CREATE TABLE ");
            iVar7 = sqlite3Strlen30(pcVar12);
            sSrc.nSrc = (short)iVar7;
            sSrc.nAlloc = (short)((uint)iVar7 >> 0x10);
            identPut(pcVar12,(int *)&sSrc,data->zName);
            iVar8 = sSrc._0_4_ + 1;
            pcVar12[(int)sSrc._0_4_] = '(';
            pCVar15 = data->aCol;
            iVar7 = 0;
            while( true ) {
              zBuf = pcVar12 + iVar8;
              if (data->nCol <= iVar7) break;
              sqlite3_snprintf(iVar16 - iVar8,zBuf,zFormat);
              iVar9 = sqlite3Strlen30(zBuf);
              sSrc._0_4_ = iVar9 + iVar8;
              identPut(pcVar12,(int *)&sSrc,pCVar15->zName);
              z = (&sqlite3Apis.update_hook)[pCVar15->affinity];
              uVar10 = sqlite3Strlen30((char *)z);
              uVar5 = sSrc._0_4_;
              memcpy(pcVar12 + (int)sSrc._0_4_,z,(ulong)uVar10);
              iVar8 = uVar10 + uVar5;
              sSrc._0_4_ = iVar8;
              iVar7 = iVar7 + 1;
              pCVar15 = pCVar15 + 1;
              zFormat = pcVar13;
            }
            sqlite3_snprintf(iVar16 - iVar8,zBuf,"%s",pcVar19);
          }
        }
        pcVar13 = "sqlite_master";
        if (iVar6 == 1) {
          pcVar13 = "sqlite_temp_master";
        }
        sqlite3NestedParse(pParse,
                           "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                           ,db->aDb[iVar6].zName,pcVar13,pcVar14,data->zName,data->zName,
                           (ulong)(uint)pParse->regRoot,pcVar12,(ulong)(uint)pParse->regRowid);
        sqlite3DbFree(db,pcVar12);
        sqlite3ChangeCookie(pParse,iVar6);
        if (((data->tabFlags & 8) != 0) && ((db->aDb[iVar6].pSchema)->pSeqTab == (Table *)0x0)) {
          sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar6].zName
                            );
        }
        pcVar14 = sqlite3MPrintf(db,"tbl_name=\'%q\'",data->zName);
        sqlite3VdbeAddParseSchemaOp(p,iVar6,pcVar14);
        if ((db->init).busy == '\0') {
          return;
        }
      }
      else {
        data->tnum = (db->init).newTnum;
      }
      pcVar14 = data->zName;
      pSVar4 = data->pSchema;
      iVar6 = sqlite3Strlen30(pcVar14);
      pvVar11 = sqlite3HashInsert(&pSVar4->tblHash,pcVar14,iVar6,data);
      if (pvVar11 == (void *)0x0) {
        pParse->pNewTable = (Table *)0x0;
        *(byte *)&db->flags = (byte)db->flags | 2;
        if (data->pSelect == (Select *)0x0) {
          pcVar14 = (pParse->sNameToken).z;
          if (pCons->z != (char *)0x0) {
            pEnd = pCons;
          }
          iVar6 = sqlite3Utf8CharLen(pcVar14,*(int *)&pEnd->z - (int)pcVar14);
          data->addColOffset = iVar6 + 0xd;
        }
      }
      else {
        db->mallocFailed = '\x01';
      }
    }
    else {
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pEList = (ExprList *)0x0;
      local_68.pAggInfo = (AggInfo *)0x0;
      local_68.pSrcList = &sSrc;
      sSrc.a[0].pSchema = (Schema *)0x0;
      sSrc.a[0].zDatabase = (char *)0x0;
      sSrc.a[0].zAlias = (char *)0x0;
      sSrc.a[0].pSelect = (Select *)0x0;
      sSrc.a[0].addrFillSub = 0;
      sSrc.a[0].regReturn = 0;
      sSrc.a[0].pOn = (Expr *)0x0;
      sSrc.a[0].pUsing = (IdList *)0x0;
      sSrc.a[0].colUsed = 0;
      sSrc.a[0].zIndex = (char *)0x0;
      sSrc.a[0].pIndex = (Index *)0x0;
      sSrc.nSrc = 1;
      sSrc.nAlloc = 0;
      sSrc._4_4_ = 0;
      sSrc.a[0].zName = data->zName;
      sSrc.a[0].jointype = '\0';
      sSrc.a[0]._57_1_ = 0;
      sSrc.a[0].iSelectId = '\0';
      sSrc.a[0]._59_1_ = 0;
      sSrc.a[0].iCursor = -1;
      local_68.ncFlags = '\x04';
      local_68._49_7_ = 0;
      pEVar3 = data->pCheck;
      lVar17 = -1;
      lVar18 = 0;
      sSrc.a[0].pTab = data;
      local_68.pParse = pParse;
      do {
        lVar17 = lVar17 + 1;
        if (pEVar3->nExpr <= lVar17) goto LAB_00160f03;
        puVar1 = (undefined8 *)((long)&pEVar3->a->pExpr + lVar18);
        lVar18 = lVar18 + 0x20;
        iVar7 = sqlite3ResolveExprNames(&local_68,(Expr *)*puVar1);
      } while (iVar7 == 0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The final ')' token in the CREATE TABLE */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;
  sqlite3 *db = pParse->db;
  int iDb;

  if( (pEnd==0 && pSelect==0) || db->mallocFailed ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  assert( !db->init.busy || !pSelect );

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
    NameContext sNC;                /* Name context for pParse->pNewTable */
    ExprList *pList;                /* List of all CHECK constraints */
    int i;                          /* Loop counter */

    memset(&sNC, 0, sizeof(sNC));
    memset(&sSrc, 0, sizeof(sSrc));
    sSrc.nSrc = 1;
    sSrc.a[0].zName = p->zName;
    sSrc.a[0].pTab = p;
    sSrc.a[0].iCursor = -1;
    sNC.pParse = pParse;
    sNC.pSrcList = &sSrc;
    sNC.ncFlags = NC_IsCheck;
    pList = p->pCheck;
    for(i=0; i<pList->nExpr; i++){
      if( sqlite3ResolveExprNames(&sNC, pList->a[i].pExpr) ){
        return;
      }
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  */
  if( db->init.busy ){
    p->tnum = db->init.newTnum;
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;
      Table *pSelTab;

      assert(pParse->nTab==1);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      sqlite3SelectDestInit(&dest, SRT_Table, 1);
      sqlite3Select(pParse, pSelect, &dest);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
      if( pParse->nErr==0 ){
        pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
        if( pSelTab==0 ) return;
        assert( p->aCol==0 );
        p->nCol = pSelTab->nCol;
        p->aCol = pSelTab->aCol;
        pSelTab->nCol = 0;
        pSelTab->aCol = 0;
        sqlite3DeleteTable(db, pSelTab);
      }
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      n = (int)(pEnd->z - pParse->sNameToken.z) + 1;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( p->tabFlags & TF_Autoincrement ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
               sqlite3MPrintf(db, "tbl_name='%q'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName,
                             sqlite3Strlen30(p->zName),p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      db->mallocFailed = 1;
      return;
    }
    pParse->pNewTable = 0;
    db->flags |= SQLITE_InternChanges;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}